

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

void __thiscall
pbrt::PiecewiseConstant1D::PiecewiseConstant1D
          (PiecewiseConstant1D *this,span<const_float> f,Float min,Float max,Allocator alloc)

{
  size_t count;
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 in_ZMM2 [64];
  float fVar7;
  undefined1 in_XMM5 [16];
  Float vb;
  Float va;
  undefined4 uStack_3c;
  Float local_38;
  Float local_34;
  
  auVar6 = in_ZMM2._0_16_;
  sVar4 = f.n;
  _va = alloc.memoryResource;
  local_38 = min;
  local_34 = max;
  pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float_const*>
            ((vector<float,pstd::pmr::polymorphic_allocator<float>> *)this,f.ptr,f.ptr + sVar4,
             (polymorphic_allocator<float> *)&va);
  count = sVar4 + 1;
  _va = alloc.memoryResource;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&this->cdf,count,(polymorphic_allocator<float> *)&va);
  this->min = local_38;
  this->max = local_34;
  this->funcInt = 0.0;
  va = local_34;
  vb = local_38;
  if (local_34 <= local_38) {
    LogFatal<char_const(&)[4],char_const(&)[4],char_const(&)[4],float&,char_const(&)[4],float&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.h"
               ,0x2bd,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [4])0x99d6bc,
               (char (*) [4])0x99d6ae,(char (*) [4])0x99d6bc,(float *)&va,(char (*) [4])0x99d6ae,&vb
              );
  }
  pfVar1 = (this->cdf).ptr;
  auVar6 = vcvtusi2ss_avx512f(auVar6,sVar4);
  *pfVar1 = 0.0;
  pfVar2 = (this->func).ptr;
  uVar5 = 1;
  fVar7 = 0.0;
  while( true ) {
    if (count <= uVar5) {
      fVar7 = pfVar1[sVar4];
      this->funcInt = fVar7;
      uVar5 = 1;
      if ((fVar7 != 0.0) || (NAN(fVar7))) {
        for (; uVar5 < count; uVar5 = uVar5 + 1) {
          pfVar1[uVar5] = pfVar1[uVar5] / this->funcInt;
        }
      }
      else {
        for (; uVar5 < count; uVar5 = uVar5 + 1) {
          auVar3 = vcvtusi2ss_avx512f(in_XMM5,uVar5);
          pfVar1[uVar5] = auVar3._0_4_ / auVar6._0_4_;
        }
      }
      return;
    }
    va = pfVar2[uVar5 - 1];
    vb = 0.0;
    if (va < 0.0) break;
    fVar7 = fVar7 + ((local_34 - local_38) * va) / auVar6._0_4_;
    pfVar1[uVar5] = fVar7;
    uVar5 = uVar5 + 1;
  }
  LogFatal<char_const(&)[12],char_const(&)[2],char_const(&)[12],float&,char_const(&)[2],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.h"
             ,0x2c2,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [12])"func[i - 1]",
             (char (*) [2])0x597e5b,(char (*) [12])"func[i - 1]",(float *)&va,(char (*) [2])0x597e5b
             ,(int *)&vb);
}

Assistant:

PiecewiseConstant1D(pstd::span<const Float> f, Float min, Float max,
                        Allocator alloc = {})
        : func(f.begin(), f.end(), alloc), cdf(f.size() + 1, alloc), min(min), max(max) {
        CHECK_GT(max, min);
        // Compute integral of step function at $x_i$
        cdf[0] = 0;
        size_t n = f.size();
        for (size_t i = 1; i < n + 1; ++i) {
            CHECK_GE(func[i - 1], 0);
            cdf[i] = cdf[i - 1] + func[i - 1] * (max - min) / n;
        }

        // Transform step function integral into CDF
        funcInt = cdf[n];
        if (funcInt == 0)
            for (size_t i = 1; i < n + 1; ++i)
                cdf[i] = Float(i) / Float(n);
        else
            for (size_t i = 1; i < n + 1; ++i)
                cdf[i] /= funcInt;
    }